

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void MercuryJson::print_json(JsonValue *value,int indent)

{
  JsonArray *pJVar1;
  JsonObject *pJVar2;
  ostream *poVar3;
  anon_union_8_6_5d63ee51_for_JsonValue_2 *paVar4;
  char *pcVar5;
  
  switch(value->type) {
  case TYPE_NULL:
    poVar3 = (ostream *)&std::cout;
    pcVar5 = "null";
    break;
  case TYPE_BOOL:
    if ((value->field_1).boolean == true) {
      poVar3 = (ostream *)&std::cout;
      pcVar5 = "true";
    }
    else {
      poVar3 = (ostream *)&std::cout;
      pcVar5 = "false";
    }
    break;
  case TYPE_STR:
    poVar3 = std::operator<<((ostream *)&std::cout,"\"");
    poVar3 = std::operator<<(poVar3,(value->field_1).str);
    pcVar5 = "\"";
    break;
  case TYPE_OBJ:
    poVar3 = std::operator<<((ostream *)&std::cout,"{");
    std::endl<char,std::char_traits<char>>(poVar3);
    paVar4 = &value->field_1;
    while (pJVar2 = paVar4->object, pJVar2 != (JsonObject *)0x0) {
      print_indent(indent + 2);
      poVar3 = std::operator<<((ostream *)&std::cout,"\"");
      poVar3 = std::operator<<(poVar3,pJVar2->key);
      std::operator<<(poVar3,"\": ");
      print_json(pJVar2->value,indent + 2);
      if (pJVar2->next != (JsonObject *)0x0) {
        std::operator<<((ostream *)&std::cout,",");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      paVar4 = (anon_union_8_6_5d63ee51_for_JsonValue_2 *)&pJVar2->next;
    }
    print_indent(indent);
    poVar3 = (ostream *)&std::cout;
    pcVar5 = "}";
    break;
  case TYPE_ARR:
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    std::endl<char,std::char_traits<char>>(poVar3);
    paVar4 = &value->field_1;
    while (pJVar1 = paVar4->array, pJVar1 != (JsonArray *)0x0) {
      print_indent(indent + 2);
      print_json(pJVar1->value,indent + 2);
      if (pJVar1->next != (JsonArray *)0x0) {
        std::operator<<((ostream *)&std::cout,",");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      paVar4 = (anon_union_8_6_5d63ee51_for_JsonValue_2 *)&pJVar1->next;
    }
    print_indent(indent);
    poVar3 = (ostream *)&std::cout;
    pcVar5 = "]";
    break;
  case TYPE_INT:
    std::ostream::_M_insert<long_long>((longlong)&std::cout);
    return;
  case TYPE_DEC:
    std::ostream::_M_insert<double>((value->field_1).decimal);
    return;
  default:
    return;
  }
  std::operator<<(poVar3,pcVar5);
  return;
}

Assistant:

void print_json(JsonValue *value, int indent) {
        int cnt;
        switch (value->type) {
            case JsonValue::TYPE_NULL:
                std::cout << "null";
                break;
            case JsonValue::TYPE_BOOL:
                if (value->boolean) std::cout << "true";
                else std::cout << "false";
                break;
            case JsonValue::TYPE_STR:
                std::cout << "\"" << value->str << "\"";
                break;
            case JsonValue::TYPE_OBJ:
                std::cout << "{" << std::endl;
                cnt = 0;
                for (auto *elem = value->object; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    std::cout << "\"" << elem->key << "\": ";
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "}";
                break;
            case JsonValue::TYPE_ARR:
                std::cout << "[" << std::endl;
                cnt = 0;
                for (auto *elem = value->array; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "]";
                break;
            case JsonValue::TYPE_INT:
                std::cout << value->integer;
                break;
            case JsonValue::TYPE_DEC:
                std::cout << value->decimal;
                break;
        }
    }